

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionDefinition.cpp
# Opt level: O1

string * __thiscall
ninx::parser::element::FunctionDefinition::dump_abi_cxx11_
          (string *__return_storage_ptr__,FunctionDefinition *this,int level)

{
  pointer puVar1;
  FunctionArgument *pFVar2;
  Block *pBVar3;
  int iVar4;
  string *psVar5;
  long *plVar6;
  ostream *poVar7;
  long *plVar8;
  unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
  *argument;
  pointer puVar9;
  stringstream s;
  long *local_218;
  long local_210;
  long local_208;
  long lStack_200;
  long *local_1f8 [2];
  long local_1e8 [2];
  ulong local_1d8;
  long local_1d0;
  string *local_1c8;
  FunctionDefinition *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1f8[0] = local_1e8;
  local_1d8 = (ulong)(uint)level;
  std::__cxx11::string::_M_construct((ulong)local_1f8,(char)level);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_1f8);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_208 = *plVar8;
    lStack_200 = plVar6[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar8;
    local_218 = (long *)*plVar6;
  }
  local_210 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_218,local_210)
  ;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar7,(this->name)._M_dataplus._M_p,(this->name)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar7," {",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  local_1d0 = (long)level;
  local_1c8 = __return_storage_ptr__;
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  puVar9 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->arguments).
           super__Vector_base<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>,_std::allocator<std::unique_ptr<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_1c0 = this;
  if (puVar9 != puVar1) {
    iVar4 = (int)local_1d8;
    do {
      pFVar2 = (puVar9->_M_t).
               super___uniq_ptr_impl<ninx::parser::element::FunctionArgument,_std::default_delete<ninx::parser::element::FunctionArgument>_>
               ._M_t.
               super__Tuple_impl<0UL,_ninx::parser::element::FunctionArgument_*,_std::default_delete<ninx::parser::element::FunctionArgument>_>
               .super__Head_base<0UL,_ninx::parser::element::FunctionArgument_*,_false>._M_head_impl
      ;
      (**(code **)((long)(pFVar2->super_ASTElement)._vptr_ASTElement + 0x18))
                (&local_218,pFVar2,iVar4 + 1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_218,local_210);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      if (local_218 != &local_208) {
        operator_delete(local_218,local_208 + 1);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar1);
  }
  pBVar3 = (local_1c0->body)._M_t.
           super___uniq_ptr_impl<ninx::parser::element::Block,_std::default_delete<ninx::parser::element::Block>_>
           ._M_t.
           super__Tuple_impl<0UL,_ninx::parser::element::Block_*,_std::default_delete<ninx::parser::element::Block>_>
           .super__Head_base<0UL,_ninx::parser::element::Block_*,_false>._M_head_impl;
  (**(code **)(*(long *)&(pBVar3->super_Expression).super_Statement + 0x18))
            (&local_218,pBVar3,(int)local_1d8 + 1);
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_218,local_210)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  psVar5 = local_1c8;
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  local_1f8[0] = local_1e8;
  std::__cxx11::string::_M_construct((ulong)local_1f8,(char)local_1d0);
  plVar6 = (long *)std::__cxx11::string::append((char *)local_1f8);
  plVar8 = plVar6 + 2;
  if ((long *)*plVar6 == plVar8) {
    local_208 = *plVar8;
    lStack_200 = plVar6[3];
    local_218 = &local_208;
  }
  else {
    local_208 = *plVar8;
    local_218 = (long *)*plVar6;
  }
  local_210 = plVar6[1];
  *plVar6 = (long)plVar8;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  poVar7 = std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)local_218,local_210)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
  std::ostream::put((char)poVar7);
  std::ostream::flush();
  if (local_218 != &local_208) {
    operator_delete(local_218,local_208 + 1);
  }
  if (local_1f8[0] != local_1e8) {
    operator_delete(local_1f8[0],local_1e8[0] + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

std::string ninx::parser::element::FunctionDefinition::dump(int level) const {
    std::stringstream s;

    s << std::string(level, '\t') + "FunctionDefinition " << this->name << " {" << std::endl;
    for (auto& argument : arguments) {
        s << argument->dump(level+1) << std::endl;
    }
    s << body->dump(level+1) << std::endl;
    s << std::string(level, '\t') + "}" << std::endl;

    return s.str();
}